

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O3

void __thiscall
CGL::SceneObjects::AreaLight::AreaLight
          (AreaLight *this,Vector3D *rad,Vector3D *pos,Vector3D *dir,Vector3D *dim_x,Vector3D *dim_y
          )

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_sample_L_00119a20;
  (this->radiance).field_0.field_0.x = (rad->field_0).field_0.x;
  (this->radiance).field_0.field_0.y = (rad->field_0).field_0.y;
  (this->radiance).field_0.field_0.z = (rad->field_0).field_0.z;
  (this->position).field_0.field_0.x = (pos->field_0).field_0.x;
  (this->position).field_0.field_0.y = (pos->field_0).field_0.y;
  (this->position).field_0.field_0.z = (pos->field_0).field_0.z;
  (this->direction).field_0.field_0.x = (dir->field_0).field_0.x;
  (this->direction).field_0.field_0.y = (dir->field_0).field_0.y;
  (this->direction).field_0.field_0.z = (dir->field_0).field_0.z;
  (this->dim_x).field_0.field_0.x = (dim_x->field_0).field_0.x;
  (this->dim_x).field_0.field_0.y = (dim_x->field_0).field_0.y;
  (this->dim_x).field_0.field_0.z = (dim_x->field_0).field_0.z;
  (this->dim_y).field_0.field_0.x = (dim_y->field_0).field_0.x;
  (this->dim_y).field_0.field_0.y = (dim_y->field_0).field_0.y;
  (this->dim_y).field_0.field_0.z = (dim_y->field_0).field_0.z;
  *(code **)&this->sampler = std::ios_base::~ios_base;
  auVar3 = *(undefined1 (*) [16])(dim_x->field_0).field_2.__vec;
  auVar3 = vdppd_avx(auVar3,auVar3,0x31);
  dVar1 = (dim_x->field_0).field_0.z;
  dVar1 = dVar1 * dVar1 + auVar3._0_8_;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar1;
    auVar3 = vsqrtsd_avx(auVar3,auVar3);
    dVar1 = auVar3._0_8_;
  }
  auVar3 = *(undefined1 (*) [16])(dim_y->field_0).field_2.__vec;
  auVar3 = vdppd_avx(auVar3,auVar3,0x31);
  dVar2 = (dim_y->field_0).field_0.z;
  dVar2 = dVar2 * dVar2 + auVar3._0_8_;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar2;
    auVar3 = vsqrtsd_avx(auVar4,auVar4);
    dVar2 = auVar3._0_8_;
  }
  this->area = dVar1 * dVar2;
  return;
}

Assistant:

AreaLight::AreaLight(const Vector3D rad, 
                     const Vector3D pos,   const Vector3D dir, 
                     const Vector3D dim_x, const Vector3D dim_y)
  : radiance(rad), position(pos), direction(dir),
    dim_x(dim_x), dim_y(dim_y), area(dim_x.norm() * dim_y.norm()) { }